

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

Opnd * __thiscall
GlobOpt::ReplaceWConst<int>(GlobOpt *this,Instr **pInstr,int value,Value **pDstVal)

{
  Instr *pIVar1;
  Opnd *this_00;
  StackSym *this_01;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  uint sourceContextId;
  uint functionId;
  IntConstOpnd *newSrc;
  undefined4 *puVar5;
  JITTimeFunctionBody *this_02;
  FunctionJITTimeInfo *this_03;
  Value *pVVar6;
  ulong value_00;
  
  pIVar1 = *pInstr;
  bVar3 = IRType_IsUnsignedInt(pIVar1->m_dst->m_type);
  value_00 = (ulong)(uint)value;
  if (!bVar3) {
    value_00 = (long)value;
  }
  newSrc = IR::IntConstOpnd::New(value_00,pIVar1->m_dst->m_type,pIVar1->m_func,false);
  IR::Instr::ReplaceSrc1(*pInstr,&newSrc->super_Opnd);
  IR::Instr::FreeSrc2(*pInstr);
  OptSrc(this,&newSrc->super_Opnd,pInstr,(Value **)0x0,(IndirOpnd *)0x0);
  this_00 = (*pInstr)->m_dst;
  OVar4 = IR::Opnd::GetKind(this_00);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_00482540;
    *puVar5 = 0;
  }
  this_01 = (StackSym *)this_00[1]._vptr_Opnd;
  if (((this_01->field_0x18 & 1) != 0) && ((this_01->field_5).m_instrDef != (Instr *)0x0)) {
    if (this_01 == (StackSym *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3088,"(dstSym)","dstSym");
      if (!bVar3) {
LAB_00482540:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    StackSym::SetIsIntConst(this_01,(long)value);
  }
  this_02 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_02);
  this_03 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_03);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,GlobOptPhase,sourceContextId,functionId);
  if (bVar3) {
    Output::Print(L"TRACE ");
    if (this->prePassLoop != (Loop *)0x0) {
      Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                    (ulong)(this->prePassLoop->loopNumber - 1));
    }
    Output::Print(L": ");
    Output::Print(L"Constant folding to %d: \n",(ulong)(uint)value);
    IR::Instr::Dump(*pInstr);
    Output::Flush();
  }
  pVVar6 = GetIntConstantValue(this,value,*pInstr,this_00);
  *pDstVal = pVVar6;
  return this_00;
}

Assistant:

IR::Opnd* GlobOpt::ReplaceWConst(IR::Instr **pInstr, T value, Value **pDstVal)
{
    IR::Instr * &instr = *pInstr;
    IR::Opnd * constOpnd = CreateIntConstOpnd(instr, value);

    instr->ReplaceSrc1(constOpnd);
    instr->FreeSrc2();

    this->OptSrc(constOpnd, &instr);

    IR::Opnd *dst = instr->GetDst();
    StackSym *dstSym = dst->AsRegOpnd()->m_sym;
    if (dstSym->IsSingleDef())
    {
        SetIsConstFlag(dstSym, value);
    }

    GOPT_TRACE_INSTR(instr, _u("Constant folding to %d: \n"), value);
    *pDstVal = GetIntConstantValue(value, instr, dst);
    return dst;
}